

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

void __thiscall
wasm::TranslateToFuzzReader::mutate(wasm::Function*)::Modder::visitExpression(wasm::Expression__
          (void *this,Expression *curr)

{
  TranslateToFuzzReader *pTVar1;
  long lVar2;
  bool bVar3;
  Index IVar4;
  Expression *pEVar5;
  Block *pBVar6;
  Expression **ppEVar7;
  Drop *pDVar8;
  Iterator IVar9;
  optional<wasm::Type> type;
  bool local_181;
  _Storage<wasm::Type,_true> local_158;
  undefined4 local_150;
  Expression *local_148;
  Expression *child;
  Index local_138;
  undefined1 local_130 [8];
  Iterator __end6;
  undefined1 local_110 [8];
  Iterator __begin6;
  ChildIterator *__range6;
  Block *block;
  undefined1 local_e8 [4];
  Index numChildren;
  ChildIterator children;
  optional<wasm::Type> local_a0;
  BasicType local_8c;
  uintptr_t local_88;
  Block *local_80;
  Expression *rep;
  Literal local_60;
  Literal local_48;
  Const *local_30;
  Const *c;
  Index local_1c;
  Expression *pEStack_18;
  int mode;
  Expression *curr_local;
  Modder *this_local;
  
  pEStack_18 = curr;
  curr_local = (Expression *)this;
  IVar4 = upTo(*(TranslateToFuzzReader **)((long)this + 0xd8),100);
  if ((IVar4 < *(uint *)((long)this + 0xe0)) &&
     (bVar3 = canBeArbitrarilyReplaced(*(TranslateToFuzzReader **)((long)this + 0xd8),pEStack_18),
     bVar3)) {
    local_1c = upTo(*(TranslateToFuzzReader **)((long)this + 0xd8),100);
    if (((*(byte *)((long)this + 0xe4) & 1) == 0) || (4 < (int)local_1c)) {
      local_30 = Expression::dynCast<wasm::Const>(pEStack_18);
      if (local_30 == (Const *)0x0) {
        local_88 = (pEStack_18->type).id;
        local_80 = (Block *)make(*(TranslateToFuzzReader **)((long)this + 0xd8),(Type)local_88);
        local_181 = false;
        if ((int)local_1c < 0x21) {
          local_8c = none;
          local_181 = Type::operator!=(&(local_80->super_SpecificExpression<(wasm::Expression::Id)1>
                                        ).super_Expression.type,&local_8c);
        }
        if (local_181 == false) {
          if ((0x41 < (int)local_1c) &&
             (bVar3 = Properties::isControlFlowStructure(pEStack_18), !bVar3)) {
            ChildIterator::ChildIterator((ChildIterator *)local_e8,pEStack_18);
            IVar4 = AbstractChildIterator<wasm::ChildIterator>::getNumChildren
                              ((AbstractChildIterator<wasm::ChildIterator> *)local_e8);
            if ((IVar4 != 0) && (IVar4 < 5)) {
              pBVar6 = Builder::makeBlock((Builder *)(*(long *)((long)this + 0xd8) + 0x10),
                                          (Expression *)0x0);
              __begin6._8_8_ = local_e8;
              IVar9 = AbstractChildIterator<wasm::ChildIterator>::begin
                                ((AbstractChildIterator<wasm::ChildIterator> *)__begin6._8_8_);
              __end6._8_8_ = IVar9.parent;
              __begin6.parent._0_4_ = IVar9.index;
              local_110 = (undefined1  [8])__end6._8_8_;
              IVar9 = AbstractChildIterator<wasm::ChildIterator>::end
                                ((AbstractChildIterator<wasm::ChildIterator> *)__begin6._8_8_);
              child = (Expression *)IVar9.parent;
              local_138 = IVar9.index;
              local_130 = (undefined1  [8])child;
              __end6.parent._0_4_ = local_138;
              while (bVar3 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator!=
                                       ((Iterator *)local_110,(Iterator *)local_130), bVar3) {
                ppEVar7 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*
                                    ((Iterator *)local_110);
                local_148 = *ppEVar7;
                bVar3 = replaceChildWith((Expression *)local_80,local_148);
                if (!bVar3) {
                  pDVar8 = Builder::makeDrop((Builder *)(*(long *)((long)this + 0xd8) + 0x10),
                                             local_148);
                  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                            (&(pBVar6->list).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,(Expression *)pDVar8);
                }
                AbstractChildIterator<wasm::ChildIterator>::Iterator::operator++
                          ((Iterator *)local_110);
              }
              bVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::empty
                                (&(pBVar6->list).
                                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                );
              if (!bVar3) {
                ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                          (&(pBVar6->list).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,(Expression *)local_80);
                std::optional<wasm::Type>::optional((optional<wasm::Type> *)&local_158);
                wasm::Block::finalize(pBVar6,local_158,local_150,0);
                local_80 = pBVar6;
              }
            }
            ChildIterator::~ChildIterator((ChildIterator *)local_e8);
          }
        }
        else if (((local_1c & 1) == 0) ||
                (bVar3 = replaceChildWith((Expression *)local_80,pEStack_18), !bVar3)) {
          lVar2 = *(long *)((long)this + 0xd8);
          pDVar8 = Builder::makeDrop((Builder *)(*(long *)((long)this + 0xd8) + 0x10),pEStack_18);
          pBVar6 = local_80;
          std::optional<wasm::Type>::optional(&local_a0);
          type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._9_7_ = 0;
          type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload =
               local_a0.super__Optional_base<wasm::Type,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Type>._M_payload;
          type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_engaged =
               local_a0.super__Optional_base<wasm::Type,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Type>._M_engaged;
          local_80 = Builder::makeSequence
                               ((Builder *)(lVar2 + 0x10),(Expression *)pDVar8,(Expression *)pBVar6,
                                type);
        }
        Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::replaceCurrent
                  ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)this,
                   (Expression *)local_80);
      }
      else if ((int)local_1c < 0x32) {
        pTVar1 = *(TranslateToFuzzReader **)((long)this + 0xd8);
        wasm::Literal::Literal(&local_60,&local_30->value);
        tweak(&local_48,pTVar1,&local_60);
        wasm::Literal::operator=(&local_30->value,&local_48);
        wasm::Literal::~Literal(&local_48);
        wasm::Literal::~Literal(&local_60);
      }
      else {
        rep = (Expression *)(pEStack_18->type).id;
        pEVar5 = make(*(TranslateToFuzzReader **)((long)this + 0xd8),(Type)rep);
        Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::replaceCurrent
                  ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)this,pEVar5);
      }
    }
    else {
      pTVar1 = *(TranslateToFuzzReader **)((long)this + 0xd8);
      Type::Type((Type *)&c,unreachable);
      pEVar5 = make(pTVar1,(Type)c);
      Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_>::replaceCurrent
                ((Walker<Modder,_wasm::UnifiedExpressionVisitor<Modder,_void>_> *)this,pEVar5);
    }
  }
  return;
}

Assistant:

void visitExpression(Expression* curr) {
      if (parent.upTo(100) < percentChance &&
          parent.canBeArbitrarilyReplaced(curr)) {
        // We can replace in various modes, see below. Generate a random number
        // up to 100 to help us there.
        int mode = parent.upTo(100);

        if (allowUnreachable && mode < 5) {
          replaceCurrent(parent.make(Type::unreachable));
          return;
        }

        // For constants, perform only a small tweaking in some cases.
        // TODO: more minor tweaks to immediates, like making a load atomic or
        // not, changing an offset, etc.
        if (auto* c = curr->dynCast<Const>()) {
          if (mode < 50) {
            c->value = parent.tweak(c->value);
          } else {
            // Just replace the entire thing.
            replaceCurrent(parent.make(curr->type));
          }
          return;
        }

        // Generate a replacement for the expression, and by default replace all
        // of |curr| (including children) with that replacement, but in some
        // cases we can do more subtle things.
        //
        // Note that such a replacement is not always valid due to nesting of
        // labels, but we'll fix that up later. Note also that make() picks a
        // subtype, so this has a chance to replace us with anything that is
        // valid to put here.
        auto* rep = parent.make(curr->type);
        if (mode < 33 && rep->type != Type::none) {
          // This has a non-none type. Replace the output, keeping the
          // expression and its children in a drop. This "interposes" between
          // this expression and its parent, something like this:
          //
          //    (D
          //      (A
          //        (B)
          //        (C)
          //      )
          //    )
          ////
          //    => ;; keep A, replace it in the parent
          //
          //    (D
          //      (block
          //        (drop
          //          (A
          //            (B)
          //            (C)
          //          )
          //        )
          //        (NEW)
          //      )
          //    )
          //
          // We also sometimes try to insert A as a child of NEW, so we actually
          // interpose directly:
          //
          //    (D
          //      (NEW
          //        (A
          //          (B)
          //          (C)
          //        )
          //      )
          //    )
          //
          // We do not do that all the time, as inserting a drop is actually an
          // important situation to test: the drop makes the output of A unused,
          // which may let optimizations remove it.
          if ((mode & 1) && replaceChildWith(rep, curr)) {
            // We managed to replace one of the children with curr, and have
            // nothing more to do.
          } else {
            // Drop curr and append.
            rep =
              parent.builder.makeSequence(parent.builder.makeDrop(curr), rep);
          }
        } else if (mode >= 66 && !Properties::isControlFlowStructure(curr)) {
          ChildIterator children(curr);
          auto numChildren = children.getNumChildren();
          if (numChildren > 0 && numChildren < 5) {
            // This is a normal (non-control-flow) expression with at least one
            // child (and not an excessive amount of them; see the processing
            // below). "Interpose" between the children and this expression by
            // keeping them and replacing the parent |curr|. We do this by
            // generating drops of the children, like this:
            //
            //  (A
            //    (B)
            //    (C)
            //  )
            //
            //  => ;; keep children, replace A
            //
            //  (block
            //    (drop (B))
            //    (drop (C))
            //    (NEW)
            //  )
            //
            auto* block = parent.builder.makeBlock();
            for (auto* child : children) {
              // Only drop the child if we can't replace it as one of NEW's
              // children. This does a linear scan of |rep| which is the reason
              // for the above limit on the number of children.
              if (!replaceChildWith(rep, child)) {
                block->list.push_back(parent.builder.makeDrop(child));
              }
            }

            if (!block->list.empty()) {
              // We need the block, that is, we did not find a place for all the
              // children.
              block->list.push_back(rep);
              block->finalize();
              rep = block;
            }
          }
        }
        replaceCurrent(rep);
      }
    }